

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcp_echo_server.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  StringArg ip;
  InetAddress udpLisetenAddr;
  sz_pid_t sVar1;
  uint uVar2;
  int iVar3;
  int mode;
  int kcpMode;
  self *psVar4;
  LogStream *this;
  int i;
  SourceFile file;
  undefined1 local_19a0 [8];
  KcpTcpEventLoop loop;
  EchoServer server;
  undefined4 local_c0;
  string local_b8;
  undefined1 auStack_94 [8];
  InetAddress tcpListenAddr;
  undefined1 auStack_58 [8];
  vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> udpListenAddr;
  
  sznet::sztool_memcheck();
  signal(2,StopSignal);
  signal(0xf,StopSignal);
  if (sznet::g_logLevel < 3) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)&server.m_mode,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/kcp_echo/kcp_echo_server.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)server._408_8_;
    file.m_size = local_c0;
    sznet::Logger::Logger((Logger *)local_19a0,file,0x7f);
    psVar4 = sznet::LogStream::operator<<((LogStream *)&loop,"pid = ");
    sVar1 = sznet::sz_getpid();
    this = sznet::LogStream::operator<<(psVar4,sVar1);
    psVar4 = sznet::LogStream::operator<<(this,", tid = ");
    sVar1 = sznet::CurrentThread::tid();
    sznet::LogStream::operator<<(psVar4,sVar1);
    sznet::Logger::~Logger((Logger *)local_19a0);
  }
  if (argc < 6) {
    printf("Usage: %s ip port thread_num mode(1-echo, others-RTT) kcp_mode(1-normal, others-quick)\n"
           ,*argv);
  }
  else {
    ip.m_str = argv[1];
    uVar2 = atoi(argv[2]);
    iVar3 = atoi(argv[3]);
    numThreads = 2;
    if (iVar3 != 0) {
      numThreads = iVar3;
    }
    mode = atoi(argv[4]);
    kcpMode = atoi(argv[5]);
    sznet::net::InetAddress::InetAddress((InetAddress *)auStack_94,ip,(uint16_t)uVar2,false);
    udpListenAddr.
    super__Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_58 = (undefined1  [8])0x0;
    udpListenAddr.
    super__Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    for (iVar3 = 1; iVar3 <= numThreads; iVar3 = iVar3 + 1) {
      local_19a0._0_4_ = (uVar2 & 0xffff) + iVar3;
      std::vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>::
      emplace_back<int>((vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *
                        )auStack_58,(int *)local_19a0);
    }
    tcpListenAddr.field_0._20_8_ = auStack_94;
    std::__cxx11::string::string((string *)&local_b8,"base",(allocator *)&loop.m_kcpMode);
    udpLisetenAddr.field_0._8_4_ = tcpListenAddr.field_0._0_4_;
    udpLisetenAddr.field_0._0_8_ = tcpListenAddr.field_0._20_8_;
    udpLisetenAddr.field_0._12_4_ = tcpListenAddr.field_0.m_addr6.sin6_flowinfo;
    udpLisetenAddr.field_0._16_4_ = tcpListenAddr.field_0._8_4_;
    udpLisetenAddr.field_0._20_8_ = tcpListenAddr.field_0._12_8_;
    sznet::net::KcpTcpEventLoop::KcpTcpEventLoop
              ((KcpTcpEventLoop *)local_19a0,udpLisetenAddr,&local_b8,0,1);
    std::__cxx11::string::~string((string *)&local_b8);
    g_pMainLoopsRun = (EventLoop *)local_19a0;
    EchoServer::EchoServer
              ((EchoServer *)&loop.m_kcpMode,(KcpTcpEventLoop *)local_19a0,
               (vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *)
               auStack_58,(InetAddress *)auStack_94,mode,kcpMode);
    EchoServer::start((EchoServer *)&loop.m_kcpMode);
    sznet::net::EventLoop::loop((EventLoop *)local_19a0);
    EchoServer::~EchoServer((EchoServer *)&loop.m_kcpMode);
    sznet::net::KcpTcpEventLoop::~KcpTcpEventLoop((KcpTcpEventLoop *)local_19a0);
    std::_Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>::
    ~_Vector_base((_Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *
                  )auStack_58);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    sznet::sztool_memcheck();
#ifdef _WIN32
    static int block = 0;
    if (block)
    {
        _CrtSetBreakAlloc(block);
    }
#endif

    signal(SIGINT, StopSignal);
    signal(SIGTERM, StopSignal);

    LOG_INFO << "pid = " << sz_getpid() << ", tid = " << CurrentThread::tid();
    if (argc <= 5)
    {
        printf("Usage: %s ip port thread_num mode(1-echo, others-RTT) kcp_mode(1-normal, others-quick)\n", argv[0]);
        return 0;
    }

    char* szSvrip = argv[1];
    uint16_t sSvrPort = static_cast<uint16_t>(atoi(argv[2]));
    numThreads = atoi(argv[3]);
    numThreads = (numThreads == 0 ? 2 : numThreads);
    int mode = atoi(argv[4]);
    int kcpMode = atoi(argv[5]);
    
    InetAddress tcpListenAddr(szSvrip, sSvrPort);
    std::vector<InetAddress> udpListenAddr;
    for (int i = 1; i <= numThreads; ++i)
    {
        udpListenAddr.emplace_back(sSvrPort + i);
    }

    KcpTcpEventLoop loop(tcpListenAddr, "base", 0);
    g_pMainLoopsRun = &loop;
    EchoServer server(&loop, udpListenAddr, tcpListenAddr, mode, kcpMode);

    server.start();

    loop.loop();

    return 0;
}